

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# latex.hpp
# Opt level: O2

string * __thiscall
viennamath::rt_latex_translator<viennamath::rt_expression_interface<double>>::
process_impl_abi_cxx11_
          (string *__return_storage_ptr__,
          rt_latex_translator<viennamath::rt_expression_interface<double>> *this,
          rt_expression_interface<double> *ptr,bool use_parenthesis)

{
  ostream *poVar1;
  undefined8 *puVar2;
  string ret;
  char *local_70;
  size_type local_68;
  char local_60;
  undefined7 uStack_5f;
  undefined8 uStack_58;
  string local_50 [32];
  
  local_70 = &local_60;
  local_68 = 0;
  local_60 = '\0';
  puVar2 = *(undefined8 **)this;
  do {
    if (puVar2 == *(undefined8 **)(this + 8)) {
      poVar1 = std::operator<<((ostream *)&std::cerr,
                               "ViennaMath: Warning: Unknown type in latex translator: ");
      poVar1 = std::ostream::_M_insert<void_const*>(poVar1);
      std::endl<char,std::char_traits<char>>(poVar1);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)__return_storage_ptr__," \\chi_{\\mathrm{unknown}} ",
                 (allocator<char> *)local_50);
      goto LAB_0011cf66;
    }
    (**(code **)(*(long *)*puVar2 + 8))(local_50,(long *)*puVar2,ptr,use_parenthesis,this);
    std::__cxx11::string::operator=((string *)&local_70,local_50);
    std::__cxx11::string::~string(local_50);
    puVar2 = puVar2 + 1;
  } while (local_68 == 0);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (local_70 == &local_60) {
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
    *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = uStack_58;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = local_70;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = CONCAT71(uStack_5f,local_60);
  }
  __return_storage_ptr__->_M_string_length = local_68;
  local_68 = 0;
  local_60 = '\0';
  local_70 = &local_60;
LAB_0011cf66:
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

std::string process_impl(InterfaceType const * ptr,
                               bool use_parenthesis = false) const
      {
        std::string ret;

        for (typename ProcessorArray::const_iterator it = processors_.begin();
                                                     it != processors_.end();
                                                   ++it)
        {
          ret = (*it)->process(ptr, use_parenthesis, *this);
          if (ret.size() > 0)
            return ret;
        }

        std::cerr << "ViennaMath: Warning: Unknown type in latex translator: " << ptr << std::endl;
        //throw "Unknown type!";
        return " \\chi_{\\mathrm{unknown}} ";
      }